

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O3

EntryInstr * IR::EntryInstr::New(OpCode opcode,Func *func)

{
  Instr *this;
  
  this = (Instr *)new<Memory::JitArenaAllocator>(0x58,func->m_alloc,0x3eba5c);
  this->globOptInstrString = (char16 *)0x0;
  this->m_opcode = EndOfBlock;
  this->ignoreOverflowBitCount = '\0';
  this->dataWidth = '\0';
  this->highlight = 0;
  *(undefined2 *)&this->field_0x36 = 0;
  *(undefined8 *)&this->field_0x38 = 0;
  this->m_noLazyHelperAssert = false;
  *(undefined3 *)&this->field_0x9 = 0;
  this->bailOutByteCodeLocation = 0;
  this->m_next = (Instr *)0x0;
  this->m_prev = (Instr *)0x0;
  this->m_func = (Func *)0x0;
  this->m_opcode = MaxByteSizedOpcodes;
  this->ignoreOverflowBitCount = ' ';
  *(undefined2 *)&this->field_0x36 = 0;
  this->m_number = 0xffffffff;
  this->m_dst = (Opnd *)0x0;
  this->m_src1 = (Opnd *)0x0;
  this->m_src2 = (Opnd *)0x0;
  this->_vptr_Instr = (_func_int **)&PTR_Dump_014d5738;
  Instr::Init(this,opcode,InstrKindEntry,func);
  return (EntryInstr *)this;
}

Assistant:

EntryInstr *
EntryInstr::New(Js::OpCode opcode, Func *func)
{
    EntryInstr * entryInstr;

    entryInstr = JitAnew(func->m_alloc, IR::EntryInstr);
    entryInstr->Init(opcode, InstrKindEntry, func);
    return entryInstr;
}